

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineRecord2.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::LineRecord2::Decode(LineRecord2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x4f < KVar1) {
    LineRecord1::Decode(&this->super_LineRecord1,stream);
    (*(this->m_StartVel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_StartVel,stream);
    (*(this->m_EndVel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EndVel,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LineRecord2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LINE_RECORD_2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LineRecord1::Decode( stream );

    stream >> KDIS_STREAM m_StartVel
           >> KDIS_STREAM m_EndVel;
}